

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_Vec3To(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *this;
  double *pdVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar4;
  char *pcVar5;
  AActor *other;
  bool bVar6;
  DVector3 u;
  DVector3 local_48;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (this->super_DThinker).super_DObject.Class;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00435be3;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          other = (AActor *)param[1].field_0.field_1.a;
          if (other == (AActor *)0x0) {
            NullParam("\"t\"");
            other = (AActor *)param[1].field_0.field_1.a;
          }
          pPVar2 = AActor::RegistrationInfo.MyClass;
          if (other != (AActor *)0x0) {
            if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar3 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
              (other->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar3);
            }
            pPVar4 = (other->super_DThinker).super_DObject.Class;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar2 && bVar6) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar6 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar2) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar6) {
              pcVar5 = "t == NULL || t->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00435c02;
            }
          }
          AActor::Vec3To(&local_48,this,other);
          if (numret < 1) {
            iVar3 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1e51,
                            "int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (ret->RegType != '\x11') {
              __assert_fail("RegType == (REGT_FLOAT | REGT_MULTIREG3)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x150,"void VMReturn::SetVector(const DVector3 &)");
            }
            pdVar1 = (double *)ret->Location;
            *pdVar1 = local_48.X;
            pdVar1[1] = local_48.Y;
            pdVar1[2] = local_48.Z;
            iVar3 = 1;
          }
          return iVar3;
        }
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_00435c02:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e50,
                    "int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00435be3:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e4f,"int AF_AActor_Vec3To(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec3To)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(t, AActor)
	ACTION_RETURN_VEC3(self->Vec3To(t));
}